

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O0

void write_chunks(png_structp write_ptr,user_chunk_info *data,int location)

{
  int local_20;
  int i;
  int location_local;
  user_chunk_info *data_local;
  png_structp write_ptr_local;
  
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    if (data->location[local_20] == (location | 1U)) {
      write_sTER_chunk(write_ptr,data);
    }
    else if (data->location[local_20] == (location | 2U)) {
      write_vpAg_chunk(write_ptr,data);
    }
  }
  return;
}

Assistant:

static void
write_chunks(png_structp write_ptr, user_chunk_info *data, int location)
{
   int i;

   /* Notice that this preserves the original chunk order, however chunks
    * intercepted by the callback will be written *after* chunks passed to
    * libpng.  This will actually reverse a pair of sTER chunks or a pair of
    * vpAg chunks, resulting in an error later.  This is not worth worrying
    * about - the chunks should not be duplicated!
    */
   for (i = 0; i < 2; ++i)
   {
      if (data->location[i] == (location | have_sTER))
         write_sTER_chunk(write_ptr, data);

      else if (data->location[i] == (location | have_vpAg))
         write_vpAg_chunk(write_ptr, data);
   }
}